

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFDofsImport.cpp
# Opt level: O2

bool iDynTree::dofsListFromURDFString
               (string *urdf_string,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *dofs)

{
  bool bVar1;
  int iVar2;
  Model *pMVar3;
  ulong uVar4;
  long *plVar5;
  ulong uVar6;
  ModelLoader loader;
  Model model;
  allocator<char> local_181;
  ModelLoader local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158 [9];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(dofs,0);
  ModelLoader::ModelLoader(&local_180);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_158,"urdf",&local_181);
  local_178._M_dataplus._M_p = (pointer)0x0;
  local_178._M_string_length = 0;
  local_178.field_2._M_allocated_capacity = 0;
  bVar1 = ModelLoader::loadModelFromString
                    (&local_180,urdf_string,local_158,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_178);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_178);
  std::__cxx11::string::~string((string *)local_158);
  pMVar3 = ModelLoader::model(&local_180);
  iDynTree::Model::Model((Model *)local_158,pMVar3);
  uVar6 = 0;
  while( true ) {
    uVar4 = iDynTree::Model::getNrOfJoints();
    if (uVar4 <= uVar6) break;
    plVar5 = (long *)iDynTree::Model::getJoint((long)local_158);
    iVar2 = (**(code **)(*plVar5 + 0x20))(plVar5);
    if (iVar2 != 0) {
      iDynTree::Model::getJointName_abi_cxx11_((long)&local_178);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)dofs,
                 &local_178);
      std::__cxx11::string::~string((string *)&local_178);
    }
    uVar6 = uVar6 + 1;
  }
  iDynTree::Model::~Model((Model *)local_158);
  ModelLoader::~ModelLoader(&local_180);
  return bVar1;
}

Assistant:

bool dofsListFromURDFString(const std::string & urdf_string,
                            std::vector<std::string>& dofs)
{
    // clear the vector
    dofs.resize(0);

    // Load a iDynTree::Model and dump the dofs name in the vector

    ModelLoader loader;
    bool ok = loader.loadModelFromString(urdf_string);
    iDynTree::Model model = loader.model();

    for(size_t jnt = 0; jnt < model.getNrOfJoints(); jnt++)
    {
        if( model.getJoint(jnt)->getNrOfDOFs() > 0 )
        {
            dofs.push_back(model.getJointName(jnt));
        }
    }

    return ok;
}